

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_cf_string_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  TValue *pTVar4;
  bool bVar5;
  lua_State *L_00;
  int iVar6;
  int iVar7;
  char *s;
  char *pcVar8;
  char *e;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  ulong local_2298;
  lua_State *local_2290;
  char *local_2288;
  ulong local_2280;
  lua_Integer local_2278;
  int local_2270;
  undefined4 uStack_226c;
  MatchState local_2268;
  luaL_Buffer local_2048;
  
  s = luaL_checklstring(L,1,(size_t *)&local_2270);
  uVar10 = 0;
  pcVar8 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar6 = lua_type(L,3);
  local_2278 = luaL_optinteger(L,4,(long)(local_2270 + 1));
  cVar1 = *pcVar8;
  if (3 < iVar6 - 3U) {
    lj_err_arg(L,3,LJ_ERR_NOSFT);
  }
  pcVar8 = pcVar8 + (cVar1 == '^');
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2268.src_end = s + CONCAT44(uStack_226c,local_2270);
  local_2290 = L;
  local_2288 = pcVar8;
  local_2268.src_init = s;
  local_2268.L = L;
  local_2048.L = L;
  do {
    iVar6 = (int)uVar10;
    if ((int)local_2278 <= iVar6) break;
    local_2268.level = 0;
    local_2268.depth = 0;
    e = match(&local_2268,s,pcVar8);
    L_00 = local_2268.L;
    if (e != (char *)0x0) {
      iVar7 = lua_type(local_2268.L,3);
      if (iVar7 - 3U < 2) {
        local_2280 = (ulong)(iVar6 + 1);
        pcVar9 = lua_tolstring(L_00,3,&local_2298);
        uVar10 = local_2280;
        pcVar8 = local_2288;
        if (local_2298 != 0) {
          uVar11 = 0;
          do {
            if (pcVar9[uVar11] == '%') {
              bVar2 = pcVar9[uVar11 + 1];
              uVar11 = uVar11 + 1;
              if ((""[(ulong)bVar2 + 1] & 8) == 0) goto LAB_00145048;
              if (bVar2 == 0x30) {
                luaL_addlstring(&local_2048,s,(long)e - (long)s);
              }
              else {
                push_onecapture(&local_2268,(char)bVar2 + -0x31,s,e);
                luaL_addvalue(&local_2048);
              }
            }
            else {
LAB_00145048:
              if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
                 (iVar6 = emptybuffer(&local_2048), iVar6 != 0)) {
                adjuststack(&local_2048);
              }
              *local_2048.p = pcVar9[uVar11];
              local_2048.p = local_2048.p + 1;
            }
            uVar11 = uVar11 + 1;
            uVar10 = local_2280;
            pcVar8 = local_2288;
          } while (uVar11 < local_2298);
        }
      }
      else {
        if (iVar7 == 5) {
          push_onecapture(&local_2268,0,s,e);
          lua_gettable(L_00,3);
        }
        else if (iVar7 == 6) {
          lua_pushvalue(L_00,3);
          iVar7 = push_captures(&local_2268,s,e);
          lj_vm_call(L_00,L_00->top + -(long)iVar7,2);
        }
        uVar3 = *(uint *)((long)L_00->top + -4);
        if (uVar3 < 0xfffffffe) {
          if (0xfffeffff < uVar3 && uVar3 != 0xfffffffb) {
            iVar6 = lua_type(L_00,-1);
            lj_err_callerv(L_00,LJ_ERR_STRGSRV,lj_obj_typename[iVar6 + 1]);
          }
        }
        else {
          L_00->top = L_00->top + -1;
          lua_pushlstring(L_00,s,(long)e - (long)s);
        }
        luaL_addvalue(&local_2048);
        uVar10 = (ulong)(iVar6 + 1);
      }
    }
    iVar6 = (int)uVar10;
    bVar5 = cVar1 != '^';
    if (e == (char *)0x0 || e <= s) {
      if (s < local_2268.src_end) {
        if ((&stack0xffffffffffffffd0 <= local_2048.p) &&
           (iVar7 = emptybuffer(&local_2048), iVar7 != 0)) {
          adjuststack(&local_2048);
        }
        *local_2048.p = *s;
        e = s + 1;
        local_2048.p = local_2048.p + 1;
      }
      else {
        bVar5 = false;
        e = s;
      }
    }
    s = e;
  } while (bVar5);
  luaL_addlstring(&local_2048,s,(long)local_2268.src_end - (long)s);
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  local_2048.lvl = 1;
  local_2290->top->n = (double)iVar6;
  pTVar4 = local_2290->top;
  local_2290->top = pTVar4 + 1;
  if ((TValue *)(ulong)(local_2290->maxstack).ptr32 <= pTVar4 + 1) {
    lj_state_growstack(local_2290,1);
  }
  return 2;
}

Assistant:

LJLIB_CF(string_gsub)
{
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, (int)(srcl+1));
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  if (!(tr == LUA_TNUMBER || tr == LUA_TSTRING ||
	tr == LUA_TFUNCTION || tr == LUA_TTABLE))
    lj_err_arg(L, 3, LJ_ERR_NOSFT);
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = ms.depth = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else
      break;
    if (anchor)
      break;
  }
  luaL_addlstring(&b, src, (size_t)(ms.src_end-src));
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}